

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableModel::itemChanged(QTableModel *this,QTableWidgetItem *item,QList<int> *roles)

{
  int iVar1;
  int iVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  undefined1 local_48 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_38;
  QTableWidgetItem *item_local;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  item_local = item;
  if (item != (QTableWidgetItem *)0x0) {
    if (item->d->headerItem == true) {
      qVar3 = QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                        (&this->verticalHeaderItems,&item_local,0);
      iVar2 = (int)qVar3;
      if (iVar2 < 0) {
        qVar3 = QtPrivate::indexOf<QTableWidgetItem*,QTableWidgetItem*>
                          (&this->horizontalHeaderItems,&item_local,0);
        iVar2 = (int)qVar3;
        if (iVar2 < 0) goto LAB_00535d7e;
        iVar1 = 1;
      }
      else {
        iVar1 = 2;
      }
      QAbstractItemModel::headerDataChanged((Orientation)this,iVar1,iVar2);
    }
    else {
      local_38.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      index((QTableModel *)local_48,(char *)this,(int)item);
      if (((-1 < (int)local_48._0_4_) && (-1 < (long)local_48._0_8_)) &&
         ((QTableWidgetItem *)local_38.ptr != (QTableWidgetItem *)0x0)) {
        QAbstractItemModel::dataChanged
                  ((QModelIndex *)this,(QModelIndex *)local_48,(QList_conflict *)local_48);
      }
    }
  }
LAB_00535d7e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableModel::itemChanged(QTableWidgetItem *item, const QList<int> &roles)
{
    if (!item)
        return;
    if (item->d->headerItem) {
        int row = verticalHeaderItems.indexOf(item);
        if (row >= 0) {
            emit headerDataChanged(Qt::Vertical, row, row);
        } else {
            int column = horizontalHeaderItems.indexOf(item);
            if (column >= 0)
                emit headerDataChanged(Qt::Horizontal, column, column);
        }
    } else {
        QModelIndex idx = index(item);
        if (idx.isValid())
            emit dataChanged(idx, idx, roles);
    }
}